

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeMaskedColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,Vec4 *colorMaskFactor,Vec4 *colorMaskNegationFactor,bool isSRGB,
          PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  int iVar2;
  int y;
  Vec3 *v;
  ulong uVar3;
  Vec4 newColor;
  Vec4 originalColor;
  Vector<float,_4> *local_98;
  int iStack_90;
  float fStack_8c;
  Vec4 *local_88;
  Vec4 *local_80;
  VecAccess<float,_4,_3> local_78;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  tcu local_40 [16];
  
  v = &this->m_sampleRegister[0].blendedRGB;
  local_88 = colorMaskFactor;
  local_80 = colorMaskNegationFactor;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    if (((SampleData *)(v + -7))->isAlive == true) {
      uVar1 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
      y = (int)((long)uVar1 % (long)numSamplesPerFragment);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&local_50,(int)colorBuffer,y,
                 inputFragments[iVar2].pixelCoord.m_data[0]);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_98);
      local_78.m_index[0] = 0;
      local_78.m_index[1] = 1;
      local_78.m_index[2] = 2;
      local_78.m_vector = (Vector<float,_4> *)&local_98;
      tcu::VecAccess<float,_4,_3>::operator=(&local_78,v);
      fStack_8c = v[1].m_data[0];
      if (isSRGB) {
        tcu::linearToSRGB((tcu *)&local_78,(Vector<float,_4> *)&local_98);
        local_98 = local_78.m_vector;
        iStack_90 = local_78.m_index[0];
        fStack_8c = (float)local_78.m_index[1];
      }
      tcu::operator*((tcu *)&local_60,local_88,(Vector<float,_4> *)&local_98);
      tcu::operator*(local_40,local_80,&local_50);
      tcu::operator+((tcu *)&local_78,&local_60,(Vector<float,_4> *)local_40);
      local_98 = local_78.m_vector;
      iStack_90 = local_78.m_index[0];
      fStack_8c = (float)local_78.m_index[1];
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,(Vector<float,_4> *)&local_98,y,
                 inputFragments[iVar2].pixelCoord.m_data[0],
                 inputFragments[iVar2].pixelCoord.m_data[1]);
    }
    v = v + 0xb;
  }
  return;
}

Assistant:

void FragmentProcessor::executeMaskedColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const Vec4& colorMaskFactor, const Vec4& colorMaskNegationFactor, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				originalColor	= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
			Vec4				newColor;

			newColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			newColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				newColor = tcu::linearToSRGB(newColor);

			newColor = colorMaskFactor*newColor + colorMaskNegationFactor*originalColor;

			colorBuffer.setPixel(newColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}